

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_ClassArray<ON_3dmConstructionPlane> * __thiscall
ON_ClassArray<ON_3dmConstructionPlane>::operator=
          (ON_ClassArray<ON_3dmConstructionPlane> *this,ON_ClassArray<ON_3dmConstructionPlane> *src)

{
  int iVar1;
  long lVar2;
  ON_wString *this_00;
  long lVar3;
  ON_wString *src_00;
  
  if (this != src) {
    iVar1 = src->m_count;
    if ((long)iVar1 < 1) {
      this->m_count = 0;
    }
    else {
      if (this->m_capacity < iVar1) {
        SetCapacity(this,(long)iVar1);
      }
      if ((this->m_a != (ON_3dmConstructionPlane *)0x0) &&
         (iVar1 = src->m_count, this->m_count = iVar1, 0 < iVar1)) {
        lVar3 = 0xa0;
        lVar2 = 0;
        do {
          src_00 = (ON_wString *)((long)&(src->m_a->m_plane).origin.x + lVar3);
          this_00 = (ON_wString *)((long)&(this->m_a->m_plane).origin.x + lVar3);
          memcpy(this_00 + -0x14,src_00 + -0x14,0x99);
          ON_wString::operator=(this_00,src_00);
          lVar2 = lVar2 + 1;
          lVar3 = lVar3 + 0xa8;
        } while (lVar2 < this->m_count);
      }
    }
  }
  return this;
}

Assistant:

ON_ClassArray<T>& ON_ClassArray<T>::operator=( const ON_ClassArray<T>& src )
{
  int i;
  if( this != &src ) {
    if ( src.m_count <= 0 ) {
      m_count = 0;
    }
    else {
      if ( m_capacity < src.m_count ) {
        SetCapacity( src.m_count );
      }
      if ( m_a ) {
        m_count = src.m_count;
        for ( i = 0; i < m_count; i++ ) {
          m_a[i] = src.m_a[i];
        }
      }
    }
  }  
  return *this;
}